

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int growOpArray(Vdbe *v,int nOp)

{
  Parse *pPVar1;
  sqlite3 *psVar2;
  uint uVar3;
  long lVar4;
  Op *pOVar5;
  
  lVar4 = 0x2a;
  if ((long)v->nOpAlloc != 0) {
    lVar4 = (long)v->nOpAlloc * 2;
  }
  pPVar1 = v->pParse;
  psVar2 = pPVar1->db;
  if (psVar2->aLimit[5] < lVar4) {
    sqlite3OomFault(psVar2);
  }
  else {
    pOVar5 = (Op *)sqlite3DbRealloc(psVar2,v->aOp,lVar4 * 0x18);
    if (pOVar5 != (Op *)0x0) {
      psVar2 = pPVar1->db;
      if (((psVar2 == (sqlite3 *)0x0) || (pOVar5 < (Op *)(psVar2->lookaside).pStart)) ||
         ((Op *)(psVar2->lookaside).pEnd <= pOVar5)) {
        uVar3 = (*sqlite3Config.m.xSize)(pOVar5);
      }
      else {
        uVar3 = (uint)(psVar2->lookaside).sz;
      }
      pPVar1->szOpAlloc = uVar3;
      v->nOpAlloc = (int)((ulong)(long)(int)uVar3 / 0x18);
      v->aOp = pOVar5;
      return 0;
    }
  }
  return 7;
}

Assistant:

static int growOpArray(Vdbe *v, int nOp){
  VdbeOp *pNew;
  Parse *p = v->pParse;

  /* The SQLITE_TEST_REALLOC_STRESS compile-time option is designed to force
  ** more frequent reallocs and hence provide more opportunities for 
  ** simulated OOM faults.  SQLITE_TEST_REALLOC_STRESS is generally used
  ** during testing only.  With SQLITE_TEST_REALLOC_STRESS grow the op array
  ** by the minimum* amount required until the size reaches 512.  Normal
  ** operation (without SQLITE_TEST_REALLOC_STRESS) is to double the current
  ** size of the op array or add 1KB of space, whichever is smaller. */
#ifdef SQLITE_TEST_REALLOC_STRESS
  sqlite3_int64 nNew = (v->nOpAlloc>=512 ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)v->nOpAlloc+nOp);
#else
  sqlite3_int64 nNew = (v->nOpAlloc ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)(1024/sizeof(Op)));
  UNUSED_PARAMETER(nOp);
#endif

  /* Ensure that the size of a VDBE does not grow too large */
  if( nNew > p->db->aLimit[SQLITE_LIMIT_VDBE_OP] ){
    sqlite3OomFault(p->db);
    return SQLITE_NOMEM;
  }

  assert( nOp<=(1024/sizeof(Op)) );
  assert( nNew>=(v->nOpAlloc+nOp) );
  pNew = sqlite3DbRealloc(p->db, v->aOp, nNew*sizeof(Op));
  if( pNew ){
    p->szOpAlloc = sqlite3DbMallocSize(p->db, pNew);
    v->nOpAlloc = p->szOpAlloc/sizeof(Op);
    v->aOp = pNew;
  }
  return (pNew ? SQLITE_OK : SQLITE_NOMEM_BKPT);
}